

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *
create_pattern_tree(pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                    *__return_storage_ptr__,string *doc)

{
  __node_base *p_Var1;
  OptionsShortcut *pOVar2;
  pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *ppVar3;
  pointer pOVar4;
  const_iterator cVar5;
  pointer psVar6;
  runtime_error *this;
  pointer ppOVar7;
  Option *opt;
  pointer pOVar8;
  _Hash_node_base *p_Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  vector<docopt::Option,_std::allocator<docopt::Option>_> options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usage_sections;
  UniqueOptions uniq_pattern_options;
  vector<docopt::Option,_std::allocator<docopt::Option>_> doc_options;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> pattern_options;
  Required pattern;
  UniqueOptions uniq_doc_options;
  undefined1 local_1b9;
  Option *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  pointer local_198;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_188;
  vector<docopt::Option,_std::allocator<docopt::Option>_> local_168;
  pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *local_150;
  string *local_148;
  pointer local_140;
  vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_108;
  vector<docopt::Option,_std::allocator<docopt::Option>_> local_d0;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> local_b8;
  Required local_a0;
  undefined1 local_80 [48];
  undefined1 auStack_50 [32];
  
  p_Var1 = &local_108._M_before_begin;
  local_108._M_buckets = &p_Var1->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"usage:","");
  parse_section(&local_120,(string *)&local_108,doc);
  if ((__node_base *)local_108._M_buckets != p_Var1) {
    operator_delete(local_108._M_buckets);
  }
  if (local_120.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_120.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"\'usage:\' (case-insensitive) not found.");
  }
  else {
    if ((ulong)((long)local_120.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_120.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      parse_defaults(&local_168,doc);
      formal_usage((string *)&local_108,
                   local_120.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      parse_pattern(&local_a0,(string *)&local_108,&local_168);
      if ((__node_base *)local_108._M_buckets != p_Var1) {
        operator_delete(local_108._M_buckets);
      }
      flat_filter<docopt::Option_const>(&local_b8,(Pattern *)&local_a0);
      std::
      _Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<docopt::Option_const**,std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>>>
                ((_Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_108,
                 local_b8.
                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_b8.
                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0,local_80,&local_188,&local_138);
      local_150 = __return_storage_ptr__;
      flat_filter<docopt::OptionsShortcut>(&local_138,(Pattern *)&local_a0);
      local_140 = local_138.
                  super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_138.
          super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_138.
          super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        ppOVar7 = local_138.
                  super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_148 = doc;
        do {
          parse_defaults(&local_d0,local_148);
          pOVar4 = local_d0.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          local_80._0_8_ = auStack_50;
          local_80._8_8_ = (pointer)0x1;
          local_80._16_8_ = (_Hash_node_base *)0x0;
          local_80._24_8_ = 0;
          local_80._32_4_ = 0x3f800000;
          local_80._40_8_ = 0;
          auStack_50._0_8_ = 0;
          pOVar8 = local_d0.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_d0.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_d0.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_00182b79:
            uVar13 = 0;
            uVar12 = 0;
            uVar11 = 0;
            uVar10 = 0;
            psVar6 = (pointer)0x0;
          }
          else {
            do {
              local_188.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pOVar8;
              cVar5 = std::
                      _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find(&local_108,(key_type *)&local_188);
              if (cVar5.super__Node_iterator_base<const_docopt::Option_*,_true>._M_cur ==
                  (__node_type *)0x0) {
                local_188.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
                local_1a8 = pOVar8;
                std::
                _Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_insert<docopt::Option_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<docopt::Option_const*,true>>>>
                          ((_Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)local_188.
                              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                           (vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                            *)&local_1a8,&local_188);
              }
              pOVar8 = pOVar8 + 1;
            } while (pOVar8 != pOVar4);
            local_1a8 = (pointer)0x0;
            uStack_1a0 = 0;
            local_198 = (pointer)0x0;
            if ((_Hash_node_base *)local_80._16_8_ == (_Hash_node_base *)0x0) goto LAB_00182b79;
            p_Var9 = (_Hash_node_base *)local_80._16_8_;
            do {
              local_1b8 = (pointer)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<docopt::Option,std::allocator<docopt::Option>,docopt::Option_const&>
                        (&_Stack_1b0,&local_1b8,(allocator<docopt::Option> *)&local_1b9,
                         (Option *)p_Var9[1]._M_nxt);
              local_188.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8;
              local_188.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_1b0._M_pi;
              local_1b8 = (Option *)0x0;
              _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Pattern>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)&local_1a8,(shared_ptr<docopt::Pattern> *)&local_188);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_188.
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_188.
                           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              if (_Stack_1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
              }
              p_Var9 = p_Var9->_M_nxt;
            } while (p_Var9 != (_Hash_node_base *)0x0);
            psVar6 = local_198;
            uVar10 = (undefined4)local_1a8;
            uVar11 = local_1a8._4_4_;
            uVar12 = (undefined4)uStack_1a0;
            uVar13 = uStack_1a0._4_4_;
          }
          pOVar2 = *ppOVar7;
          local_198 = (pointer)0x0;
          local_1a8 = (pointer)0x0;
          uStack_1a0 = 0;
          local_188.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pOVar2->super_Optional).super_BranchPattern.fChildren.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pOVar2->super_Optional).super_BranchPattern.fChildren.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar6;
          local_188.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pOVar2->super_Optional).super_BranchPattern.fChildren.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_188.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pOVar2->super_Optional).super_BranchPattern.fChildren.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          *(undefined4 *)
           &(pOVar2->super_Optional).super_BranchPattern.fChildren.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = uVar10;
          *(undefined4 *)
           ((long)&(pOVar2->super_Optional).super_BranchPattern.fChildren.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4) = uVar11;
          *(undefined4 *)
           &(pOVar2->super_Optional).super_BranchPattern.fChildren.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = uVar12;
          *(undefined4 *)
           ((long)&(pOVar2->super_Optional).super_BranchPattern.fChildren.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar13;
          auStack_50._8_8_ = 0;
          auStack_50._16_8_ = (pointer)0x0;
          auStack_50._24_8_ = 0;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector(&local_188);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)(auStack_50 + 8));
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)&local_1a8);
          std::
          _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_80);
          std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&local_d0);
          ppOVar7 = ppOVar7 + 1;
        } while (ppOVar7 != local_140);
      }
      if (local_138.
          super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.
                        super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      ppVar3 = local_150;
      (local_150->first).super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_a0.super_BranchPattern.fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_150->first).super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_a0.super_BranchPattern.fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (local_150->first).super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_a0.super_BranchPattern.fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a0.super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0.super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_150->first).super_BranchPattern.super_Pattern._vptr_Pattern =
           (_func_int **)&PTR_flat_001b8470;
      (local_150->second).super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_168.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
      (local_150->second).super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_168.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (local_150->second).super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_168.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_168.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_108);
      if (local_b8.
          super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_a0.super_BranchPattern.super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001b8680;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_a0.super_BranchPattern.fChildren);
      std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&local_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_120);
      return ppVar3;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"More than one \'usage:\' (case-insensitive).");
  }
  *(undefined ***)this = &PTR__runtime_error_001b8658;
  __cxa_throw(this,&docopt::DocoptLanguageError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<Required, std::vector<Option>> create_pattern_tree(std::string const& doc)
{
	auto usage_sections = parse_section("usage:", doc);
	if (usage_sections.empty()) {
		throw DocoptLanguageError("'usage:' (case-insensitive) not found.");
	}
	if (usage_sections.size() > 1) {
		throw DocoptLanguageError("More than one 'usage:' (case-insensitive).");
	}
	
	std::vector<Option> options = parse_defaults(doc);
	Required pattern = parse_pattern(formal_usage(usage_sections[0]), options);
	
	std::vector<Option const*> pattern_options = flat_filter<Option const>(pattern);
	
	using UniqueOptions = std::unordered_set<Option const*, PatternHasher, PatternPointerEquality>;
	UniqueOptions const uniq_pattern_options { pattern_options.begin(), pattern_options.end() };
	
	// Fix up any "[options]" shortcuts with the actual option tree
	for(auto& options_shortcut : flat_filter<OptionsShortcut>(pattern)) {
		std::vector<Option> doc_options = parse_defaults(doc);
		
		// set(doc_options) - set(pattern_options)
		UniqueOptions uniq_doc_options;
		for(auto const& opt : doc_options) {
			if (uniq_pattern_options.count(&opt))
				continue;
			uniq_doc_options.insert(&opt);
		}
		
		// turn into shared_ptr's and set as children
		PatternList children;
		std::transform(uniq_doc_options.begin(), uniq_doc_options.end(),
			       std::back_inserter(children), [](Option const* opt) {
				       return std::make_shared<Option>(*opt);
			       });
		options_shortcut->setChildren(std::move(children));
	}
	
	return { std::move(pattern), std::move(options) };
}